

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall icu_63::VArray::~VArray(VArray *this)

{
  int local_14;
  int i;
  VArray *this_local;
  
  if (this->deleter != (Fn_Deleter)0x0) {
    for (local_14 = 0; local_14 < this->size; local_14 = local_14 + 1) {
      (*this->deleter)(this->buf[local_14]);
    }
  }
  uprv_free_63(this->buf);
  return;
}

Assistant:

~VArray() {
        if (deleter) {
            for (int i = 0; i < size; ++i) {
                (*deleter)(buf[i]);
            }
        }
        uprv_free(buf); 
    }